

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone_example_universe.h
# Opt level: O3

void CloneUniverse(Example *in,Example *out)

{
  long lVar1;
  ulong uVar2;
  CD_Scene local_80 [8];
  vector<sch::S_Object_*,_std::allocator<sch::S_Object_*>_> local_78 [24];
  vector<std::vector<sch::CD_Pair_*,_std::allocator<sch::CD_Pair_*>_>,_std::allocator<std::vector<sch::CD_Pair_*,_std::allocator<sch::CD_Pair_*>_>_>_>
  local_60 [24];
  vector<std::vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>,_std::allocator<std::vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>_>_>
  local_48 [24];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_30 [24];
  
  Example::initializeUniverse(out);
  sch::CD_Scene::CD_Scene(local_80);
  std::vector<sch::S_Object_*,_std::allocator<sch::S_Object_*>_>::operator=
            ((vector<sch::S_Object_*,_std::allocator<sch::S_Object_*>_> *)&out->field_0x8,local_78);
  std::
  vector<std::vector<sch::CD_Pair_*,_std::allocator<sch::CD_Pair_*>_>,_std::allocator<std::vector<sch::CD_Pair_*,_std::allocator<sch::CD_Pair_*>_>_>_>
  ::operator=((vector<std::vector<sch::CD_Pair_*,_std::allocator<sch::CD_Pair_*>_>,_std::allocator<std::vector<sch::CD_Pair_*,_std::allocator<sch::CD_Pair_*>_>_>_>
               *)&out->field_0x20,local_60);
  std::
  vector<std::vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>,_std::allocator<std::vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>_>_>
  ::operator=((vector<std::vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>,_std::allocator<std::vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>_>_>
               *)&out->field_0x38,local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&out->field_0x50,local_30);
  sch::CD_Scene::~CD_Scene(local_80);
  lVar1 = *(long *)&in->field_0x8;
  if (*(long *)&in->field_0x10 != lVar1) {
    uVar2 = 0;
    do {
      (**(code **)(**(long **)(lVar1 + uVar2 * 8) + 8))();
      sch::CD_Scene::addObject((S_Object *)out);
      uVar2 = uVar2 + 1;
      lVar1 = *(long *)&in->field_0x8;
    } while (uVar2 < (ulong)(*(long *)&in->field_0x10 - lVar1 >> 3));
  }
  return;
}

Assistant:

inline void CloneUniverse(Example & in, Example & out)
{
  // Initialize the universe to have the correct names
  out.initializeUniverse();
  // Clear the scene
  out.sObj = sch::CD_Scene();
  for(size_t i = 0; i < in.sObj.size(); ++i)
  {
    out.sObj.addObject(in.sObj[i]->clone());
  }
}